

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
VisitLogicalCount(ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
                  *this,LogicalCountExpr e)

{
  char *__s;
  size_t sVar1;
  BasicWriter<char> *pBVar2;
  NumericExpr e_00;
  CountExpr e_01;
  BasicStringRef<char> value;
  LogicalCountExpr e_local;
  
  pBVar2 = this->writer_;
  e_local = e;
  __s = mp::expr::str(*(Kind *)e.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.
                               super_ExprBase.impl_);
  sVar1 = strlen(__s);
  value.size_ = sVar1;
  value.data_ = __s;
  pBVar2 = fmt::BasicWriter<char>::operator<<(pBVar2,value);
  fmt::BasicWriter<char>::operator<<(pBVar2,' ');
  e_00 = LogicalCountExpr::lhs(&e_local);
  Visit(this,(NumericExpr)e_00.super_ExprBase.impl_,-1);
  fmt::BasicWriter<char>::operator<<(this->writer_,' ');
  e_01 = LogicalCountExpr::rhs(&e_local);
  ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
  WriteArgs<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
            ((ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>
              *)this,(BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
                      )e_01.super_BasicExpr<(mp::expr::Kind)47,_(mp::expr::Kind)47>.super_ExprBase.
                       impl_,", ",0);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitLogicalCount(LogicalCountExpr e) {
  writer_ << str(e.kind()) << ' ';
  Visit(e.lhs());
  writer_ << ' ';
  WriteArgs(e.rhs());
}